

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonobject.cpp
# Opt level: O2

qsizetype indexOf<QStringView>
                    (QExplicitlySharedDataPointer<QCborContainerPrivate> *o,QStringView key,
                    bool *keyExists)

{
  QCborContainerPrivate *pQVar1;
  anon_union_8_2_4ee71171_for_Element_0 *paVar2;
  long lVar3;
  anon_union_8_2_4ee71171_for_Element_0 *paVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  difference_type __d;
  ulong uVar8;
  anon_union_8_2_4ee71171_for_Element_0 *e;
  long in_FS_OFFSET;
  anon_union_8_2_4ee71171_for_Element_0 local_48;
  anon_union_8_2_4ee71171_for_Element_0 aStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (o->d).ptr;
  paVar2 = &((pQVar1->elements).d.ptr)->field_0;
  lVar3 = (pQVar1->elements).d.size;
  uVar7 = lVar3 / 2;
  paVar4 = paVar2;
  while (e = paVar4, 0 < (long)uVar7) {
    uVar8 = uVar7 >> 1;
    paVar4 = e + uVar8 * 4;
    local_48 = *paVar4;
    aStack_40 = paVar4[1];
    iVar6 = QCborContainerPrivate::stringCompareElement<QStringView>
                      ((o->d).ptr,(Element *)&local_48,key,ForOrdering);
    uVar7 = ~uVar8 + uVar7;
    paVar4 = paVar4 + 4;
    if (-1 < iVar6) {
      uVar7 = uVar8;
      paVar4 = e;
    }
  }
  if (e == paVar2 + lVar3 * 2) {
    bVar5 = false;
  }
  else {
    bVar5 = QCborContainerPrivate::stringEqualsElement<QStringView>((o->d).ptr,(Element *)e,key);
  }
  *keyExists = bVar5;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (long)e - (long)paVar2 >> 4;
  }
  __stack_chk_fail();
}

Assistant:

static qsizetype indexOf(const QExplicitlySharedDataPointer<QCborContainerPrivate> &o,
                         String key, bool *keyExists)
{
    const auto begin = QJsonPrivate::ConstKeyIterator(o->elements.constBegin());
    const auto end = QJsonPrivate::ConstKeyIterator(o->elements.constEnd());

    const auto it = std::lower_bound(
                begin, end, key,
                [&](const QJsonPrivate::ConstKeyIterator::value_type &e, const String &key) {
        return o->stringCompareElement(e.key(), key, QtCbor::Comparison::ForOrdering) < 0;
    });

    *keyExists = (it != end) && o->stringEqualsElement((*it).key(), key);
    return it.it - begin.it;
}